

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iot_c_utility.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  STRING_HANDLE pSVar3;
  char *pcVar4;
  HTTPAPIEX_HANDLE handle;
  IO_INTERFACE_DESCRIPTION *pIVar5;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    pSVar3 = platform_get_platform_info(PLATFORM_INFO_OPTION_RETRIEVE_SQM);
    if (pSVar3 != (STRING_HANDLE)0x0) {
      pcVar4 = STRING_c_str(pSVar3);
      printf("%s\r\n",pcVar4);
      STRING_delete(pSVar3);
    }
    pSVar3 = SASToken_CreateString("key","scope","name",0x3ade68b1);
    if (pSVar3 == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/samples/iot_c_utility/iot_c_utility.c"
                  ,"show_sastoken_example",0x2e,1,"Failed to create SAS Token.\n");
      }
    }
    else {
      STRING_delete(pSVar3);
    }
    handle = HTTPAPIEX_Create("www.bing.com");
    if (handle == (HTTPAPIEX_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/samples/iot_c_utility/iot_c_utility.c"
                  ,"http_examples",0x20,1,"Failed creating httpApiEx handle");
      }
    }
    else {
      HTTPAPIEX_Destroy(handle);
    }
    pIVar5 = http_proxy_io_get_interface_description();
    if (pIVar5 == (IO_INTERFACE_DESCRIPTION *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/samples/iot_c_utility/iot_c_utility.c"
                  ,"test_http_proxy_io",0x17,1,"Failed to create interface_desc.\n");
      }
    }
    platform_deinit();
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/samples/iot_c_utility/iot_c_utility.c"
                ,"main",0x46,1,"Cannot initialize platform.\n");
    }
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    (void)argc, (void)argv;

    if (platform_init() != 0)
    {
        LogError("Cannot initialize platform.\n");
    }
    else
    {
        show_platform_info();
        show_sastoken_example();
#ifdef USE_HTTP
        http_examples();
        test_http_proxy_io();
#endif
        platform_deinit();
    }
    return 0;
}